

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void check_duplex<float>(float *input_buffer,float *output_buffer,long frame_count,
                        int input_channel_count)

{
  undefined4 uVar1;
  bool bVar2;
  char *pcVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  int input_index;
  int output_index;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar4;
  undefined4 in_stack_ffffffffffffff48;
  int iVar5;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar6;
  Message *in_stack_ffffffffffffff50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  AssertHelper local_a0;
  Message local_98;
  AssertionResult local_90;
  String local_80;
  AssertHelper local_70;
  Message local_68;
  AssertionResult local_60;
  uint local_4c;
  AssertHelper local_48;
  Message local_40;
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_34 = 0x100;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffff58.ptr_,(char *)in_stack_ffffffffffffff50,
             (long *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar2) {
    testing::Message::Message(in_stack_ffffffffffffff50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10fa1b);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x2ad,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x10fa6b);
  }
  local_4c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fa8a);
  if (local_4c == 0) {
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (bool)in_stack_ffffffffffffff3f);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar2) {
      testing::Message::Message(in_stack_ffffffffffffff50);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)&local_80,&local_60.success_,"!!output_buffer","false");
      pcVar3 = testing::internal::String::c_str(&local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x2af,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::String::~String
                ((String *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      testing::Message::~Message((Message *)0x10fb51);
    }
    local_4c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fb6d);
    if (local_4c == 0) {
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (bool)in_stack_ffffffffffffff3f);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_90);
      if (!bVar2) {
        testing::Message::Message(in_stack_ffffffffffffff50);
        testing::internal::GetBoolAssertionFailureMessage
                  ((AssertionResult *)&stack0xffffffffffffff50,&local_90.success_,"!!input_buffer",
                   "false");
        pcVar3 = testing::internal::String::c_str((String *)&stack0xffffffffffffff50);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x2b0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::internal::String::~String
                  ((String *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        testing::Message::~Message((Message *)0x10fc34);
      }
      local_4c = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fc50);
      if (local_4c == 0) {
        iVar6 = 0;
        iVar5 = 0;
        for (iVar4 = 0; iVar4 < local_18; iVar4 = iVar4 + 1) {
          if (local_1c == 1) {
            uVar1 = *(undefined4 *)(local_8 + (long)iVar4 * 4);
            *(undefined4 *)(local_10 + (long)(iVar6 + 1) * 4) = uVar1;
            *(undefined4 *)(local_10 + (long)iVar6 * 4) = uVar1;
          }
          else if (local_1c == 2) {
            *(undefined4 *)(local_10 + (long)iVar6 * 4) = *(undefined4 *)(local_8 + (long)iVar5 * 4)
            ;
            *(undefined4 *)(local_10 + (long)(iVar6 + 1) * 4) =
                 *(undefined4 *)(local_8 + (long)(iVar5 + 1) * 4);
          }
          iVar6 = iVar6 + 2;
          iVar5 = local_1c + iVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void check_duplex(const T * input_buffer,
                  T * output_buffer, long frame_count,
                  int input_channel_count)
{
  ASSERT_EQ(frame_count, 256);
  // Silence scan-build warning.
  ASSERT_TRUE(!!output_buffer); assert(output_buffer);
  ASSERT_TRUE(!!input_buffer); assert(input_buffer);

  int output_index = 0;
  int input_index = 0;
  for (int i = 0; i < frame_count; i++) {
    // output is two channels, input one or two channels.
    if (input_channel_count == 1) {
      output_buffer[output_index] = output_buffer[output_index + 1] = input_buffer[i];
    } else if (input_channel_count == 2) {
      output_buffer[output_index] = input_buffer[input_index];
      output_buffer[output_index + 1] = input_buffer[input_index + 1];
    }
    output_index += 2;
    input_index += input_channel_count;
  }
}